

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 扑克牌比大小.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int label2;
  istream *piVar2;
  ostream *poVar3;
  string *psVar4;
  string str;
  string poker2;
  string poker1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&str);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&str);
      return 0;
    }
    std::__cxx11::string::find((char)&str,0x2d);
    std::__cxx11::string::substr((ulong)&poker1,(ulong)&str);
    std::__cxx11::string::substr((ulong)&poker2,(ulong)&str);
    std::__cxx11::string::string((string *)&local_50,(string *)&poker1);
    iVar1 = check_style(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&poker2);
    label2 = check_style(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90,(string *)&poker1);
    std::__cxx11::string::string((string *)&local_b0,(string *)&poker2);
    iVar1 = poker_compare(&local_90,iVar1,&local_b0,label2);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    psVar4 = &poker1;
    if (iVar1 == 1) {
LAB_00102411:
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)psVar4);
    }
    else {
      if (iVar1 == 0) {
        psVar4 = &poker2;
        goto LAB_00102411;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"ERROR");
    }
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&poker2);
    std::__cxx11::string::~string((string *)&poker1);
  } while( true );
}

Assistant:

int main()
{
    string str;
    while (getline(cin,str))
    {
        int pos=str.find('-');
        string poker1=str.substr(0,pos);
        string poker2=str.substr(pos+1,str.size()-pos+1);
        int label1,label2;
        label1 = check_style(poker1);
        label2 = check_style(poker2);
        int compare = poker_compare(poker1,label1,poker2,label2);
        if (compare==0)
            cout<<poker2<<endl;
        else if (compare==1)
            cout<<poker1<<endl;
        else
            cout<<"ERROR"<<endl;
    }
    return 0;
}